

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void QPDF::compute_encryption_parameters_V5
               (char *user_password,char *owner_password,int V,int R,int key_len,int P,
               bool encrypt_metadata,string *id1,string *encryption_key,string *O,string *U,
               string *OE,string *UE,string *Perms)

{
  string *psVar1;
  long *plVar2;
  ulong *puVar3;
  size_type *psVar4;
  string *encryption_key_00;
  size_type __dnew;
  string validation_salt;
  string intermediate_key;
  char k_2 [16];
  char k_1 [16];
  uchar k [32];
  EncryptionData data;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  int local_18c;
  undefined1 local_188 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  size_type local_148;
  size_type local_140;
  char *local_138;
  char *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  EncryptionData local_108;
  
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_18c = V;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_138 = owner_password;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_130 = user_password;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  EncryptionData::EncryptionData
            (&local_108,local_18c,R,key_len,P,&local_1f8,&local_218,&local_1d8,&local_238,&local_1b0
             ,id1,encrypt_metadata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  QUtil::initializeWithRandomBytes((uchar *)&local_128,0x20);
  local_218._M_dataplus._M_p = (pointer)0x20;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f8,(ulong)&local_218);
  local_1f8.field_2._M_allocated_capacity = (size_type)local_218._M_dataplus._M_p;
  *(undefined8 *)(local_1f8._M_dataplus._M_p + 0x10) = local_118;
  *(undefined8 *)(local_1f8._M_dataplus._M_p + 0x18) = uStack_110;
  *(undefined8 *)local_1f8._M_dataplus._M_p = local_128;
  *(undefined8 *)(local_1f8._M_dataplus._M_p + 8) = uStack_120;
  local_1f8._M_string_length = (size_type)local_218._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p[local_218._M_dataplus._M_p] = '\0';
  std::__cxx11::string::operator=((string *)encryption_key,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168._M_local_buf,local_130,&local_1b1);
  QUtil::initializeWithRandomBytes((uchar *)&local_148,0x10);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8.field_2._M_allocated_capacity = local_148;
  local_1f8._M_string_length = 8;
  local_1f8.field_2._M_local_buf[8] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218.field_2._M_allocated_capacity = local_140;
  local_218._M_string_length = 8;
  local_218.field_2._M_local_buf[8] = '\0';
  psVar1 = (string *)(local_188 + 0x10);
  local_188._8_8_ = 0;
  local_188[0x10] = '\0';
  local_188._0_8_ = psVar1;
  hash_V5(&local_1b0,(string *)&local_168,&local_1f8,(string *)local_188,&local_108);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_1f8._M_dataplus._M_p);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  puVar3 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_238.field_2._M_allocated_capacity = *puVar3;
    local_238.field_2._8_8_ = plVar2[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *puVar3;
    local_238._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_238._M_string_length = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_238,(ulong)local_218._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8.field_2._8_8_ = plVar2[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_1d8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)U,(string *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_188._0_8_ != psVar1) {
    operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
  }
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  hash_V5(&local_1d8,(string *)&local_168,&local_218,&local_238,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  process_with_aes(&local_238,&local_1d8,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)UE,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_allocated_capacity != &local_158) {
    operator_delete((void *)local_168._M_allocated_capacity,local_158._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,local_138,(allocator<char> *)&local_148);
  QUtil::initializeWithRandomBytes((uchar *)&local_168._M_allocated_capacity,0x10);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8.field_2._M_allocated_capacity = local_168._M_allocated_capacity;
  local_1f8._M_string_length = 8;
  local_1f8.field_2._M_local_buf[8] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218.field_2._M_allocated_capacity = local_168._8_8_;
  local_218._M_string_length = 8;
  local_218.field_2._M_local_buf[8] = '\0';
  hash_V5(&local_1b0,(string *)local_188,&local_1f8,U,&local_108);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_1f8._M_dataplus._M_p);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_238.field_2._M_allocated_capacity = *psVar4;
    local_238.field_2._8_8_ = plVar2[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar4;
    local_238._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_238._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_238,(ulong)local_218._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8.field_2._8_8_ = plVar2[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_1d8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)O,(string *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  hash_V5(&local_1d8,(string *)local_188,&local_218,U,&local_108);
  process_with_aes(&local_238,&local_1d8,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)OE,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  encryption_key_00 = (string *)local_188._0_8_;
  if ((string *)local_188._0_8_ != psVar1) {
    operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
  }
  compute_Perms_value_V5_clear(encryption_key_00,&local_108,(uchar *)&local_1d8);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_238._M_dataplus._M_p = (pointer)0x10;
  local_1f8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f8,(ulong)&local_238);
  local_1f8.field_2._M_allocated_capacity = (size_type)local_238._M_dataplus._M_p;
  *(pointer *)local_1f8._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
  *(size_type *)(local_1f8._M_dataplus._M_p + 8) = local_1d8._M_string_length;
  local_1f8._M_string_length = (size_type)local_238._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p[local_238._M_dataplus._M_p] = '\0';
  process_with_aes(&local_218,encryption_key,true,&local_1f8,0,1,(uchar *)0x0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::operator=((string *)Perms,(string *)&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  EncryptionData::setV5EncryptionParameters(&local_108,O,OE,U,UE,Perms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.id1._M_dataplus._M_p != &local_108.id1.field_2) {
    operator_delete(local_108.id1._M_dataplus._M_p,local_108.id1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Perms._M_dataplus._M_p != &local_108.Perms.field_2) {
    operator_delete(local_108.Perms._M_dataplus._M_p,
                    local_108.Perms.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.UE._M_dataplus._M_p != &local_108.UE.field_2) {
    operator_delete(local_108.UE._M_dataplus._M_p,local_108.UE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.OE._M_dataplus._M_p != &local_108.OE.field_2) {
    operator_delete(local_108.OE._M_dataplus._M_p,local_108.OE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.U._M_dataplus._M_p != &local_108.U.field_2) {
    operator_delete(local_108.U._M_dataplus._M_p,local_108.U.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.O._M_dataplus._M_p != &local_108.O.field_2) {
    operator_delete(local_108.O._M_dataplus._M_p,local_108.O.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF::compute_encryption_parameters_V5(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    int P,
    bool encrypt_metadata,
    std::string const& id1,
    std::string& encryption_key,
    std::string& O,
    std::string& U,
    std::string& OE,
    std::string& UE,
    std::string& Perms)
{
    EncryptionData data(V, R, key_len, P, "", "", "", "", "", id1, encrypt_metadata);
    unsigned char k[key_bytes];
    QUtil::initializeWithRandomBytes(k, key_bytes);
    encryption_key = std::string(reinterpret_cast<char*>(k), key_bytes);
    compute_U_UE_value_V5(user_password, encryption_key, data, U, UE);
    compute_O_OE_value_V5(owner_password, encryption_key, data, U, O, OE);
    Perms = compute_Perms_value_V5(encryption_key, data);
    data.setV5EncryptionParameters(O, OE, U, UE, Perms);
}